

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bad_alloc *anon_var_0;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  _union_1457 _Stack_108;
  sigaction sa;
  string local_60 [8];
  string parquetOutFile;
  bool local_3e;
  bool local_3d;
  string local_38 [2];
  bool ordOutput;
  bool skipHeader;
  int opt;
  string subFolder;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  std::__cxx11::string::string(local_38);
  local_3d = false;
  local_3e = false;
  std::__cxx11::string::string(local_60);
  while (iVar2 = getopt(argc,argv,"osvhK:p:"), iVar2 != -1) {
    switch(iVar2) {
    case 0x4b:
      std::__cxx11::string::operator=(local_38,_optarg);
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x6f:
      local_3e = true;
      break;
    case 0x70:
      std::__cxx11::string::operator=(local_60,_optarg);
      break;
    case 0x73:
      local_3d = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s: version: %s\n",*argv,"");
      exit(1);
    }
  }
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    fprintf(_stderr,"FATAL: No folder supplied for summarycalc files\n");
    exit(1);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    fprintf(_stderr,
            "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
           );
    exit(1);
  }
  sa.sa_mask.__val[0xe] = 0;
  sa.sa_mask.__val[0xf] = 0;
  sa.sa_mask.__val[0xc] = 0;
  sa.sa_mask.__val[0xd] = 0;
  sa.sa_mask.__val[10] = 0;
  sa.sa_mask.__val[0xb] = 0;
  sa.sa_mask.__val[8] = 0;
  sa.sa_mask.__val[9] = 0;
  sa.sa_mask.__val[6] = 0;
  sa.sa_mask.__val[7] = 0;
  sa.sa_mask.__val[4] = 0;
  sa.sa_mask.__val[5] = 0;
  sa.sa_mask.__val[2] = 0;
  sa.sa_mask.__val[3] = 0;
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1] = 0;
  _Stack_108.sa_handler = (__sighandler_t)0x0;
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sa.sa_flags = 0;
  sa._140_4_ = 0;
  sigemptyset((sigset_t *)&sa);
  _Stack_108.sa_handler = segfault_sigaction;
  sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
  sigaction(0xb,(sigaction *)&_Stack_108,(sigaction *)0x0);
  pcVar1 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,pcVar1,&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"INFO",&local_151);
  logprintf((string *)local_128,(string *)local_150,"starting process..\n");
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  aalcalcmeanonly::DoIt((string *)local_38,local_3d,local_3e,(string *)local_60);
  pcVar1 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,pcVar1,&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"INFO",(allocator *)((long)&anon_var_0 + 7));
  logprintf((string *)local_178,(string *)local_1a0,"finishing process..\n");
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  std::string subFolder;
  int opt;
  bool skipHeader = false;
  bool ordOutput = false;
  std::string parquetOutFile;

  while ((opt = getopt(argc, argv, (char *)"osvhK:p:")) != -1) {
    switch (opt) {
      case 'v':
#ifdef HAVE_PARQUET
        fprintf(stderr, "%s : version: %s : Parquet output enabled\n",
                argv[0], VERSION);
#else
        fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
#endif
	exit(EXIT_FAILURE);
      case 's':
        skipHeader = true;
        break;
      case 'o':
        ordOutput = true;
        break;
      case 'K':
        subFolder = optarg;
        break;
      case 'p':
        parquetOutFile = optarg;
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (subFolder.length() == 0) {
    fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
    exit(EXIT_FAILURE);
  }

#ifndef HAVE_PARQUET
  if (!parquetOutFile.empty()) {
    fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
                    "Please install libraries and recompile to use this option.\n");
    exit(EXIT_FAILURE);
  }
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    logprintf(progname, "INFO", "starting process..\n");
    aalcalcmeanonly::DoIt(subFolder, skipHeader, ordOutput, parquetOutFile);
    logprintf(progname, "INFO", "finishing process..\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);
  }

  return EXIT_SUCCESS;

}